

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsgridlayout.cpp
# Opt level: O3

void __thiscall QGraphicsGridLayout::removeAt(QGraphicsGridLayout *this,int index)

{
  int iVar1;
  int iVar2;
  long *plVar3;
  Orientation OVar4;
  long lVar5;
  QGridLayoutItem *pQVar6;
  long in_FS_OFFSET;
  char local_58 [24];
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (index < 0) {
LAB_005d4d8e:
    local_58[0] = '\x02';
    local_58[1] = '\0';
    local_58[2] = '\0';
    local_58[3] = '\0';
    local_58[4] = '\0';
    local_58[5] = '\0';
    local_58[6] = '\0';
    local_58[7] = '\0';
    local_58[8] = '\0';
    local_58[9] = '\0';
    local_58[10] = '\0';
    local_58[0xb] = '\0';
    local_58[0xc] = '\0';
    local_58[0xd] = '\0';
    local_58[0xe] = '\0';
    local_58[0xf] = '\0';
    local_58[0x10] = '\0';
    local_58[0x11] = '\0';
    local_58[0x12] = '\0';
    local_58[0x13] = '\0';
    local_58[0x14] = '\0';
    local_58[0x15] = '\0';
    local_58[0x16] = '\0';
    local_58[0x17] = '\0';
    local_40 = "default";
    QMessageLogger::warning(local_58,"QGraphicsGridLayout::removeAt: invalid index %d",index);
  }
  else {
    pQVar6 = (QGridLayoutItem *)
             ((this->super_QGraphicsLayout).super_QGraphicsLayoutItem.d_ptr.d[1].cachedSizeHints + 1
             );
    iVar1 = QGridLayoutEngine::itemCount();
    if (iVar1 <= index) goto LAB_005d4d8e;
    OVar4 = (Orientation)pQVar6;
    plVar3 = (long *)QGridLayoutEngine::itemAt(OVar4);
    if (plVar3 != (long *)0x0) {
      if ((QGraphicsLayoutItem *)plVar3[5] != (QGraphicsLayoutItem *)0x0) {
        QGraphicsLayoutItem::setParentLayoutItem
                  ((QGraphicsLayoutItem *)plVar3[5],(QGraphicsLayoutItem *)0x0);
      }
      QGridLayoutEngine::removeItem(pQVar6);
      local_58[0] = '\x01';
      local_58[1] = '\0';
      local_58[2] = '\0';
      local_58[3] = '\0';
      local_58[4] = '\x02';
      local_58[5] = '\0';
      local_58[6] = '\0';
      local_58[7] = '\0';
      lVar5 = 0;
      do {
        iVar1 = QGridLayoutEngine::rowCount(OVar4);
        iVar2 = QGridLayoutItem::lastRow((Orientation)plVar3);
        if (iVar2 == iVar1 + -1) {
          iVar2 = QGridLayoutEngine::effectiveLastRow(OVar4);
          QGridLayoutEngine::insertOrRemoveRows(OVar4,iVar2 + 1,(iVar2 + 1) - iVar1);
        }
        lVar5 = lVar5 + 4;
      } while (lVar5 != 8);
      (**(code **)(*plVar3 + 8))(plVar3);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        (*(this->super_QGraphicsLayout).super_QGraphicsLayoutItem._vptr_QGraphicsLayoutItem[7])
                  (this);
        return;
      }
      goto LAB_005d4ddf;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_005d4ddf:
  __stack_chk_fail();
}

Assistant:

void QGraphicsGridLayout::removeAt(int index)
{
    Q_D(QGraphicsGridLayout);
    if (index < 0 || index >= d->engine.itemCount()) {
        qWarning("QGraphicsGridLayout::removeAt: invalid index %d", index);
        return;
    }

    if (QGraphicsGridLayoutEngineItem *gridItem = static_cast<QGraphicsGridLayoutEngineItem*>(d->engine.itemAt(index))) {
        if (QGraphicsLayoutItem *layoutItem = gridItem->layoutItem())
            layoutItem->setParentLayoutItem(nullptr);
        d->engine.removeItem(gridItem);

        // recalculate rowInfo.count if we remove an item that is on the right/bottommost row
        for (const Qt::Orientation orient : {Qt::Horizontal, Qt::Vertical}) {
            const int oldCount = d->engine.rowCount(orient);
            if (gridItem->lastRow(orient) == oldCount - 1) {
                const int newCount = d->engine.effectiveLastRow(orient) + 1;
                d->engine.removeRows(newCount, oldCount - newCount, orient);
            }
        }

        delete gridItem;
        invalidate();
    }
}